

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O3

void __thiscall Lexer::Lexify(Lexer *this,char *code)

{
  Lexeme *pLVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  LexemeType LVar5;
  byte *pbVar6;
  byte bVar7;
  byte *pbVar8;
  byte *pbVar9;
  LexemeType LVar10;
  ulong uVar11;
  byte *pbVar12;
  uint uVar13;
  bool bVar14;
  
  if ((this->lexems).max < 0x801) {
    SmallArray<Lexeme,_32U>::grow(&this->lexems,0x800);
  }
  this->line = 0;
  uVar13 = 0;
  pbVar12 = (byte *)code;
LAB_0020e632:
  bVar7 = *code;
LAB_0020e635:
  pbVar8 = (byte *)code + 1;
  pbVar6 = (byte *)code + -1;
  uVar3 = ~(uint)code;
LAB_0020e643:
  uVar11 = 1;
  iVar4 = (int)code;
  if (0x5a < bVar7) {
    if (0x7a < bVar7) {
      switch(bVar7) {
      case 0x7b:
        LVar10 = lex_ofigure;
        goto LAB_0020ecd5;
      case 0x7c:
        goto switchD_0020e7e3_caseD_7c;
      case 0x7d:
        LVar10 = lex_cfigure;
        goto LAB_0020ecd5;
      case 0x7e:
        LVar10 = lex_bitnot;
        goto LAB_0020ecd5;
      default:
        goto switchD_0020e66b_caseD_b;
      }
    }
    if (bVar7 == 0x5b) {
      LVar10 = lex_obracket;
      goto LAB_0020ecd5;
    }
    if (bVar7 == 0x5d) {
      LVar10 = lex_cbracket;
      goto LAB_0020ecd5;
    }
    if (bVar7 != 0x5e) goto switchD_0020e66b_caseD_b;
    if (((byte *)code)[1] == 0x5e) {
      LVar10 = lex_logxor;
    }
    else {
      if (((byte *)code)[1] != 0x3d) {
        LVar10 = lex_bitxor;
        goto LAB_0020ecd5;
      }
      LVar10 = lex_xorset;
    }
    goto LAB_0020eccf;
  }
  switch(bVar7) {
  case 9:
  case 0x20:
    goto switchD_0020e66b_caseD_9;
  case 10:
    code = (char *)((byte *)code + 1);
    uVar13 = uVar13 + 1;
    this->line = uVar13;
    pbVar12 = (byte *)code;
    goto LAB_0020e632;
  case 0xb:
  case 0xc:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x1f:
  case 0x23:
  case 0x24:
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
    goto switchD_0020e66b_caseD_b;
  case 0xd:
    pbVar12 = (byte *)code + 2;
    pbVar8 = (byte *)code + 1;
    code = (char *)((byte *)code + 1);
    if (*pbVar8 == 10) {
      code = (char *)pbVar12;
    }
    uVar13 = uVar13 + 1;
    this->line = uVar13;
    pbVar12 = (byte *)code;
    goto LAB_0020e632;
  case 0x21:
    bVar7 = ((byte *)code)[1];
    LVar10 = lex_lognot;
    LVar5 = lex_nequal;
    goto LAB_0020eb0d;
  case 0x22:
    pbVar8 = (byte *)code + 1;
    goto LAB_0020ea5d;
  case 0x25:
    bVar7 = ((byte *)code)[1];
    LVar10 = lex_mod;
    LVar5 = lex_modset;
LAB_0020eb0d:
    uVar3 = (uint)(bVar7 == 0x3d);
    if (bVar7 == 0x3d) {
      LVar10 = LVar5;
    }
LAB_0020eb10:
    uVar11 = (ulong)(uVar3 + 1);
    goto LAB_0020ecd5;
  case 0x26:
    if (((byte *)code)[1] == 0x26) {
      LVar10 = lex_logand;
    }
    else {
      if (((byte *)code)[1] != 0x3d) {
        LVar10 = lex_bitand;
        goto LAB_0020ecd5;
      }
      LVar10 = lex_andset;
    }
    break;
  case 0x27:
    pbVar8 = (byte *)code + 1;
    goto LAB_0020e990;
  case 0x28:
    LVar10 = lex_oparen;
    goto LAB_0020ecd5;
  case 0x29:
    LVar10 = lex_cparen;
    goto LAB_0020ecd5;
  case 0x2a:
    if (((byte *)code)[1] == 0x3d) {
      uVar11 = 2;
      LVar10 = lex_mulset;
    }
    else {
      if (((byte *)code)[1] == 0x2a) {
        bVar14 = ((byte *)code)[2] == 0x3d;
        uVar3 = (uint)bVar14;
        LVar10 = lex_pow;
        LVar5 = lex_powset;
        goto LAB_0020eb70;
      }
      LVar10 = lex_mul;
    }
    goto LAB_0020ecd5;
  case 0x2b:
    if (((byte *)code)[1] == 0x3d) {
      LVar10 = lex_addset;
    }
    else {
      if (((byte *)code)[1] != 0x2b) {
        LVar10 = lex_add;
        goto LAB_0020ecd5;
      }
      LVar10 = lex_inc;
    }
    break;
  case 0x2c:
    LVar10 = lex_comma;
    goto LAB_0020ecd5;
  case 0x2d:
    if (((byte *)code)[1] == 0x3d) {
      LVar10 = lex_subset;
    }
    else {
      if (((byte *)code)[1] != 0x2d) {
        LVar10 = lex_sub;
        goto LAB_0020ecd5;
      }
      LVar10 = lex_dec;
    }
    break;
  case 0x2e:
    LVar10 = lex_point;
    goto LAB_0020ecd5;
  case 0x2f:
    goto switchD_0020e66b_caseD_2f;
  case 0x3a:
    LVar10 = lex_colon;
    goto LAB_0020ecd5;
  case 0x3b:
    LVar10 = lex_semicolon;
    goto LAB_0020ecd5;
  case 0x3c:
    if (((byte *)code)[1] == 0x3d) {
      uVar11 = 2;
      LVar10 = lex_lequal;
    }
    else {
      if (((byte *)code)[1] == 0x3c) {
        bVar14 = ((byte *)code)[2] == 0x3d;
        uVar3 = (uint)bVar14;
        LVar10 = lex_shl;
        LVar5 = lex_shlset;
        goto LAB_0020eb70;
      }
      LVar10 = lex_less;
    }
    goto LAB_0020ecd5;
  case 0x3d:
    uVar3 = (uint)(((byte *)code)[1] == 0x3d);
    LVar10 = (uint)(((byte *)code)[1] != 0x3d) * 9 + lex_equal;
    goto LAB_0020eb10;
  case 0x3e:
    if (((byte *)code)[1] == 0x3d) {
      uVar11 = 2;
      LVar10 = lex_gequal;
    }
    else if (((byte *)code)[1] == 0x3e) {
      bVar14 = ((byte *)code)[2] == 0x3d;
      uVar3 = (uint)bVar14;
      LVar10 = lex_shr;
      LVar5 = lex_shrset;
LAB_0020eb70:
      if (bVar14) {
        LVar10 = LVar5;
      }
      uVar11 = (ulong)(uVar3 | 2);
    }
    else {
      LVar10 = lex_greater;
    }
    goto LAB_0020ecd5;
  case 0x3f:
    LVar10 = lex_questionmark;
    goto LAB_0020ecd5;
  case 0x40:
    LVar10 = lex_at;
    goto LAB_0020ecd5;
  default:
    if (bVar7 != 0) {
switchD_0020e66b_caseD_b:
      if ((byte)(bVar7 - 0x30) < 10) {
        if ((bVar7 == 0x30) && (((byte *)code)[1] == 0x78)) {
          for (pbVar6 = (byte *)code + 2;
              (bVar7 = *pbVar6, (byte)(bVar7 - 0x30) < 10 || ((byte)((bVar7 & 0xdf) + 0xbf) < 6));
              pbVar6 = pbVar6 + 1) {
          }
        }
        else {
          do {
            bVar7 = pbVar6[1];
            pbVar6 = pbVar6 + 1;
          } while ((byte)(bVar7 - 0x30) < 10);
        }
        pbVar8 = pbVar6 + (bVar7 == 0x2e);
        do {
          pbVar6 = pbVar8;
          pbVar8 = pbVar6 + 1;
        } while ((byte)(*pbVar6 - 0x30) < 10);
        pbVar9 = pbVar6;
        if ((*pbVar6 == 0x65) && (pbVar9 = pbVar8, *pbVar8 == 0x2d)) {
          pbVar9 = pbVar6 + 2;
        }
        uVar11 = (ulong)(uVar3 + (int)pbVar9);
        do {
          bVar7 = *pbVar9;
          pbVar9 = pbVar9 + 1;
          uVar11 = (ulong)((int)uVar11 + 1);
          LVar10 = lex_number;
        } while ((byte)(bVar7 - 0x30) < 10);
      }
      else {
        LVar10 = lex_none;
        if ((char)""[bVar7] < '\0') {
          uVar2 = 0;
          do {
            uVar11 = uVar2;
            uVar2 = uVar11 + 1;
          } while ((""[((byte *)code)[uVar11]] & 0x40) != 0);
          switch((int)uVar11) {
          case 2:
            uVar11 = 2;
            if (*(short *)code == 0x6669) {
              LVar10 = lex_if;
            }
            else {
              if (*(short *)code != 0x6e69) {
                bVar14 = *(short *)code == 0x6f64;
                uVar11 = 2;
                LVar5 = lex_do;
                goto LAB_0020f0b6;
              }
              LVar10 = lex_in;
            }
            break;
          case 3:
            uVar11 = 3;
            if (((byte *)code)[2] == 0x72 && *(short *)code == 0x6f66) {
              LVar10 = lex_for;
            }
            else {
              if (((byte *)code)[2] != 0x66 || *(short *)code != 0x6572) {
                bVar14 = ((byte *)code)[2] == 0x77 && *(short *)code == 0x656e;
                LVar5 = lex_new;
                goto LAB_0020f0b6;
              }
              LVar10 = lex_ref;
            }
            break;
          case 4:
            uVar11 = 4;
            if (*(int *)code == 0x65736163) {
              LVar10 = lex_case;
            }
            else if (*(int *)code == 0x65736c65) {
              LVar10 = lex_else;
            }
            else if (*(int *)code == 0x6f747561) {
              LVar10 = lex_auto;
            }
            else if (*(int *)code == 0x65757274) {
              LVar10 = lex_true;
            }
            else {
              if (*(int *)code != 0x6d756e65) {
                bVar14 = *(int *)code == 0x68746977;
                LVar5 = lex_with;
                goto LAB_0020f0b6;
              }
              LVar10 = lex_enum;
            }
            break;
          case 5:
            uVar11 = 5;
            if (((byte *)code)[4] == 0x65 && *(int *)code == 0x6c696877) {
              LVar10 = lex_while;
            }
            else if (((byte *)code)[4] == 0x6b && *(int *)code == 0x61657262) {
              LVar10 = lex_break;
            }
            else if (((byte *)code)[4] == 0x73 && *(int *)code == 0x73616c63) {
              LVar10 = lex_class;
            }
            else if (((byte *)code)[4] == 0x6e && *(int *)code == 0x67696c61) {
              LVar10 = lex_align;
            }
            else if (((byte *)code)[4] == 100 && *(int *)code == 0x6c656979) {
              LVar10 = lex_yield;
            }
            else {
              if (((byte *)code)[4] != 0x74 || *(int *)code != 0x736e6f63) {
                bVar14 = ((byte *)code)[4] == 0x65 && *(int *)code == 0x736c6166;
                LVar5 = lex_false;
                goto LAB_0020f0b6;
              }
              LVar10 = lex_const;
            }
            break;
          case 6:
            uVar11 = 6;
            if (*(short *)((byte *)code + 4) == 0x6863 && *(int *)code == 0x74697773) {
              LVar10 = lex_switch;
            }
            else if (*(short *)((byte *)code + 4) == 0x6e72 && *(int *)code == 0x75746572) {
              LVar10 = lex_return;
            }
            else if (*(short *)((byte *)code + 4) == 0x666f && *(int *)code == 0x65707974) {
              LVar10 = lex_typeof;
            }
            else {
              if (*(short *)((byte *)code + 4) != 0x666f || *(int *)code != 0x657a6973) {
                bVar14 = *(short *)((byte *)code + 4) == 0x7472 && *(int *)code == 0x6f706d69;
                LVar5 = lex_import;
                goto LAB_0020f0b6;
              }
              LVar10 = lex_sizeof;
            }
            break;
          case 7:
            uVar11 = 7;
            if (*(int *)((byte *)code + 3) == 0x6e67696c && *(int *)code == 0x6c616f6e) {
              LVar10 = lex_noalign;
            }
            else if (*(int *)((byte *)code + 3) == 0x746c7561 && *(int *)code == 0x61666564) {
              LVar10 = lex_default;
            }
            else if (*(int *)((byte *)code + 3) == 0x66656465 && *(int *)code == 0x65707974) {
              LVar10 = lex_typedef;
            }
            else {
              if (*(int *)((byte *)code + 3) != 0x7274706c || *(int *)code != 0x6c6c756e) {
                bVar14 = *(int *)((byte *)code + 3) == 0x63697265 && *(int *)code == 0x656e6567;
                LVar5 = lex_generic;
                goto LAB_0020f0b6;
              }
              LVar10 = lex_nullptr;
            }
            break;
          case 8:
            uVar11 = 8;
            if (*(long *)code == 0x65756e69746e6f63) {
              LVar10 = lex_continue;
            }
            else {
              bVar14 = *(long *)code == 0x726f74617265706f;
              LVar5 = lex_operator;
LAB_0020f0b6:
              LVar10 = lex_string;
              if (bVar14) {
                LVar10 = LVar5;
              }
            }
            break;
          case 9:
            uVar11 = 9;
            if (((byte *)code)[8] != 0x65 || *(long *)code != 0x6e6974756f726f63) {
              bVar14 = ((byte *)code)[8] == 0x65 && *(long *)code == 0x63617073656d616e;
              LVar5 = lex_namespace;
              goto LAB_0020f0b6;
            }
            LVar10 = lex_coroutine;
            break;
          case 10:
            LVar10 = lex_string;
            if (*(short *)((byte *)code + 8) == 0x656c && *(long *)code == 0x6261646e65747865) {
              LVar10 = lex_extendable;
            }
            uVar11 = 10;
            break;
          default:
            LVar10 = lex_string;
          }
        }
      }
      goto LAB_0020ecd5;
    }
    uVar3 = (this->lexems).count;
    if (uVar3 == (this->lexems).max) {
      SmallArray<Lexeme,_32U>::grow(&this->lexems,uVar3);
    }
    pLVar1 = (this->lexems).data;
    if (pLVar1 != (Lexeme *)0x0) {
      uVar3 = (this->lexems).count;
      (this->lexems).count = uVar3 + 1;
      pLVar1[uVar3].type = lex_none;
      pLVar1[uVar3].pos = code;
      pLVar1[uVar3].length = 1;
      pLVar1[uVar3].line = uVar13;
      pLVar1[uVar3].column = iVar4 - (int)pbVar12;
      return;
    }
    goto LAB_0020f26b;
  }
  goto LAB_0020eccf;
switchD_0020e66b_caseD_2f:
  bVar7 = ((byte *)code)[1];
  if (bVar7 == 0x2a) goto code_r0x0020e67b;
  if (bVar7 == 0x3d) {
    uVar11 = 2;
    LVar10 = lex_divset;
    goto LAB_0020ecd5;
  }
  LVar10 = lex_div;
  if (bVar7 != 0x2f) goto LAB_0020ecd5;
  while ((bVar7 != 0 && (bVar7 != 10))) {
    pbVar8 = (byte *)code + 1;
    code = (char *)((byte *)code + 1);
    bVar7 = *pbVar8;
  }
  goto LAB_0020e632;
code_r0x0020e67b:
  pbVar9 = (byte *)code + 2;
  code = (char *)((byte *)code + 2);
  pbVar8 = pbVar8 + 2;
  pbVar6 = pbVar6 + 2;
  uVar3 = uVar3 - 2;
  bVar7 = 0;
  if (*pbVar9 != 0) goto code_r0x0020e693;
  goto LAB_0020e643;
code_r0x0020e693:
  iVar4 = 1;
  bVar7 = *pbVar9;
  do {
    if (bVar7 < 0x22) {
      if (bVar7 == 10) {
        code = (char *)((byte *)code + 1);
        uVar13 = uVar13 + 1;
        this->line = uVar13;
        pbVar12 = (byte *)code;
      }
      else {
        if (bVar7 != 0xd) goto LAB_0020e76c;
        pbVar12 = (byte *)code + 2;
        pbVar8 = (byte *)code + 1;
        code = (char *)((byte *)code + 1);
        if (*pbVar8 == 10) {
          code = (char *)pbVar12;
        }
        uVar13 = uVar13 + 1;
        this->line = uVar13;
        pbVar12 = (byte *)code;
      }
    }
    else {
      if (bVar7 == 0x22) {
LAB_0020e6d0:
        code = (char *)((byte *)code + 1);
        do {
          while (bVar7 = *code, bVar7 < 0x22) {
            if (bVar7 == 0) {
LAB_0020e727:
              code = (char *)((byte *)code + (bVar7 == 0x22));
              goto LAB_0020e782;
            }
            if (bVar7 == 10) {
              code = (char *)((byte *)code + 1);
            }
            else {
              if (bVar7 != 0xd) goto LAB_0020e6d0;
              pbVar12 = (byte *)code + 2;
              pbVar8 = (byte *)code + 1;
              code = (char *)((byte *)code + 1);
              if (*pbVar8 == 10) {
                code = (char *)pbVar12;
              }
            }
            uVar13 = uVar13 + 1;
            this->line = uVar13;
            pbVar12 = (byte *)code;
          }
          if (bVar7 != 0x5c) {
            if (bVar7 == 0x22) goto LAB_0020e727;
            goto LAB_0020e6d0;
          }
          if (((byte *)code)[1] == 0) goto LAB_0020e6d0;
          code = (char *)((byte *)code + 2);
        } while( true );
      }
      if (bVar7 == 0x2f) {
        if (((byte *)code)[1] != 0x2a) goto LAB_0020e76c;
        code = (char *)((byte *)code + 2);
        iVar4 = iVar4 + 1;
      }
      else if ((bVar7 == 0x2a) && (((byte *)code)[1] == 0x2f)) {
        code = (char *)((byte *)code + 2);
        iVar4 = iVar4 + -1;
      }
      else {
LAB_0020e76c:
        code = (char *)((byte *)code + 1);
      }
    }
LAB_0020e782:
    bVar7 = *code;
  } while ((bVar7 != 0) && (iVar4 != 0));
  goto LAB_0020e635;
LAB_0020e990:
  bVar7 = *pbVar8;
  if (0x26 < bVar7) {
    if (bVar7 == 0x5c) {
      if (pbVar8[1] == 0) goto LAB_0020e9d6;
      pbVar8 = pbVar8 + 2;
    }
    else {
      if (bVar7 == 0x27) goto LAB_0020e9ee;
LAB_0020e9d6:
      pbVar8 = pbVar8 + 1;
    }
    goto LAB_0020e990;
  }
  if (bVar7 != 0) {
    if (bVar7 == 10) {
      pbVar8 = pbVar8 + 1;
    }
    else {
      if (bVar7 != 0xd) goto LAB_0020e9d6;
      pbVar12 = pbVar8 + 1;
      pbVar6 = pbVar8 + 2;
      pbVar8 = pbVar8 + 1;
      if (*pbVar12 == 10) {
        pbVar8 = pbVar6;
      }
    }
    uVar13 = uVar13 + 1;
    this->line = uVar13;
    pbVar12 = pbVar8;
    goto LAB_0020e990;
  }
LAB_0020e9ee:
  uVar11 = (ulong)((((int)pbVar8 + 1) - (uint)(bVar7 == 0)) - iVar4);
  LVar10 = lex_semiquotedchar;
  goto LAB_0020ecd5;
LAB_0020ea5d:
  bVar7 = *pbVar8;
  if (0x21 < bVar7) {
    if (bVar7 == 0x5c) {
      if (pbVar8[1] == 0) goto LAB_0020eaa3;
      pbVar8 = pbVar8 + 2;
    }
    else {
      if (bVar7 == 0x22) goto LAB_0020eabb;
LAB_0020eaa3:
      pbVar8 = pbVar8 + 1;
    }
    goto LAB_0020ea5d;
  }
  if (bVar7 != 0) {
    if (bVar7 == 10) {
      pbVar8 = pbVar8 + 1;
    }
    else {
      if (bVar7 != 0xd) goto LAB_0020eaa3;
      pbVar12 = pbVar8 + 1;
      pbVar6 = pbVar8 + 2;
      pbVar8 = pbVar8 + 1;
      if (*pbVar12 == 10) {
        pbVar8 = pbVar6;
      }
    }
    uVar13 = uVar13 + 1;
    this->line = uVar13;
    pbVar12 = pbVar8;
    goto LAB_0020ea5d;
  }
LAB_0020eabb:
  uVar11 = (ulong)((((int)pbVar8 + 1) - (uint)(bVar7 == 0)) - iVar4);
  LVar10 = lex_quotedstring;
LAB_0020ecd5:
  uVar3 = (this->lexems).count;
  if (uVar3 == (this->lexems).max) {
    SmallArray<Lexeme,_32U>::grow(&this->lexems,uVar3);
  }
  pLVar1 = (this->lexems).data;
  if (pLVar1 == (Lexeme *)0x0) {
LAB_0020f26b:
    __assert_fail("data",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                  ,0x162,"void SmallArray<Lexeme, 32>::push_back(const T &) [T = Lexeme, N = 32]");
  }
  uVar3 = (this->lexems).count;
  (this->lexems).count = uVar3 + 1;
  pLVar1[uVar3].type = LVar10;
  pLVar1[uVar3].pos = code;
  pLVar1[uVar3].length = (uint)uVar11;
  pLVar1[uVar3].line = uVar13;
  pLVar1[uVar3].column = iVar4 - (int)pbVar12;
  code = (char *)((byte *)code + (int)(uint)uVar11);
  uVar13 = this->line;
  goto LAB_0020e632;
  while (pbVar8 = (byte *)code + 1, bVar7 != 0xd) {
switchD_0020e66b_caseD_9:
    code = (char *)pbVar8;
    bVar7 = *code;
    if (((byte)(bVar7 - 0x21) < 0xe0) || (bVar7 == 10)) break;
  }
  goto LAB_0020e632;
switchD_0020e7e3_caseD_7c:
  if (((byte *)code)[1] == 0x7c) {
    LVar10 = lex_logor;
    goto LAB_0020eccf;
  }
  if (((byte *)code)[1] != 0x3d) {
    LVar10 = lex_bitor;
    goto LAB_0020ecd5;
  }
  LVar10 = lex_orset;
LAB_0020eccf:
  uVar11 = 2;
  goto LAB_0020ecd5;
}

Assistant:

void Lexer::Lexify(const char* code)
{
	lexems.reserve(2048);

	const char *lineStart = code;
	line = 0;

	LexemeType lType = lex_none;
	int lLength = 1;

	while(*code)
	{
		switch(*code)
		{
		case '\r':
			code++;

			if(*code == '\n')
				code++;

			lineStart = code;
			line++;

			continue;
		case '\n':
			code++;

			lineStart = code;
			line++;

			continue;
		case ' ':
		case '\t':
			code++;
			while((unsigned char)(code[0] - 1) < ' ' && *code != '\r' && *code != '\n')
				code++;
			continue;
		case '\"':
			lType = lex_quotedstring;
			{
				const char *pos = code;
				pos++;

				while(*pos && *pos != '\"')
				{
					if(pos[0] == '\\' && pos[1])
					{
						pos += 2;
					}
					else if(pos[0] == '\r')
					{
						pos++;

						if(*pos == '\n')
							pos++;

						lineStart = pos;
						line++;
					}
					else if(pos[0] == '\n')
					{
						pos++;

						lineStart = pos;
						line++;
					}
					else
					{
						pos += 1;
					}
				}

				if(*pos)
					pos++;

				lLength = (int)(pos - code);
			}
			break;
		case '\'':
			lType = lex_semiquotedchar;
			{
				const char *pos = code;
				pos++;

				while(*pos && *pos != '\'')
				{
					if(pos[0] == '\\' && pos[1])
					{
						pos += 2;
					}
					else if(pos[0] == '\r')
					{
						pos++;

						if(*pos == '\n')
							pos++;

						lineStart = pos;
						line++;
					}
					else if(pos[0] == '\n')
					{
						pos++;

						lineStart = pos;
						line++;
					}
					else
					{
						pos += 1;
					}
				}

				if(*pos)
					pos++;

				lLength = (int)(pos - code);
			}
			break;
		case '.':
			lType = lex_point;
			break;
		case ',':
			lType = lex_comma;
			break;
		case '+':
			lType = lex_add;
			if(code[1] == '=')
			{
				lType = lex_addset;
				lLength = 2;
			}else if(code[1] == '+'){
				lType = lex_inc;
				lLength = 2;
			}
			break;
		case '-':
			lType = lex_sub;
			if(code[1] == '=')
			{
				lType = lex_subset;
				lLength = 2;
			}else if(code[1] == '-'){
				lType = lex_dec;
				lLength = 2;
			}
			break;
		case '*':
			lType = lex_mul;
			if(code[1] == '=')
			{
				lType = lex_mulset;
				lLength = 2;
			}else if(code[1] == '*'){
				lType = lex_pow;
				lLength = 2;
				if(code[2] == '=')
				{
					lType = lex_powset;
					lLength = 3;
				}
			}
			break;
		case '/':
			if(code[1] == '=')
			{
				lType = lex_divset;
				lLength = 2;
			}else if(code[1] == '/'){
				while(code[0] != '\n' && code[0] != '\0')
					code++;
				continue;
			}else if(code[1] == '*'){
				code += 2;
				unsigned depth = 1;
				while(*code && depth)
				{
					if(code[0] == '*' && code[1] == '/')
					{
						code += 2;
						depth--;
					}
					else if(code[0] == '/' && code[1] == '*')
					{
						code += 2;
						depth++;
					}
					else if(code[0] == '\"')
					{
						code++;

						while(code[0] && code[0] != '\"')
						{
							if(code[0] == '\\' && code[1])
							{
								code += 2;
							}
							else if(code[0] == '\r')
							{
								code++;

								if(*code == '\n')
									code++;

								lineStart = code;
								line++;
							}
							else if(code[0] == '\n')
							{
								code++;

								lineStart = code;
								line++;
							}
							else
							{
								code += 1;
							}
						}

						if(code[0] == '\"')
							code++;
					}
					else if(code[0] == '\r')
					{
						code++;

						if(*code == '\n')
							code++;

						lineStart = code;
						line++;
					}
					else if(code[0] == '\n')
					{
						code++;

						lineStart = code;
						line++;
					}
					else
					{
						code++;
					}
				}
				continue;
			}else{
				lType = lex_div;
			}
			break;
		case '%':
			lType = lex_mod;
			if(code[1] == '=')
			{
				lType = lex_modset;
				lLength = 2;
			}
			break;
		case '<':
			lType = lex_less;
			if(code[1] == '=')
			{
				lType = lex_lequal;
				lLength = 2;
			}else if(code[1] == '<'){
				lType = lex_shl;
				lLength = 2;
				if(code[2] == '=')
				{
					lType = lex_shlset;
					lLength = 3;
				}
			}
			break;
		case '>':
			lType = lex_greater;
			if(code[1] == '=')
			{
				lType = lex_gequal;
				lLength = 2;
			}else if(code[1] == '>'){
				lType = lex_shr;
				lLength = 2;
				if(code[2] == '=')
				{
					lType = lex_shrset;
					lLength = 3;
				}
			}
			break;
		case '=':
			lType = lex_set;
			if(code[1] == '=')
			{
				lType = lex_equal;
				lLength = 2;
			}
			break;
		case '!':
			lType = lex_lognot;
			if(code[1] == '=')
			{
				lType = lex_nequal;
				lLength = 2;
			}
			break;
		case '@':
			lType = lex_at;
			break;
		case '~':
			lType = lex_bitnot;
			break;
		case '&':
			lType = lex_bitand;
			if(code[1] == '&')
			{
				lType = lex_logand;
				lLength = 2;
			}else if(code[1] == '='){
				lType = lex_andset;
				lLength = 2;
			}
			break;
		case '|':
			lType = lex_bitor;
			if(code[1] == '|')
			{
				lType = lex_logor;
				lLength = 2;
			}else if(code[1] == '='){
				lType = lex_orset;
				lLength = 2;
			}
			break;
		case '^':
			lType = lex_bitxor;
			if(code[1] == '^')
			{
				lType = lex_logxor;
				lLength = 2;
			}else if(code[1] == '='){
				lType = lex_xorset;
				lLength = 2;
			}
			break;
		case '(':
			lType = lex_oparen;
			break;
		case ')':
			lType = lex_cparen;
			break;
		case '[':
			lType = lex_obracket;
			break;
		case ']':
			lType = lex_cbracket;
			break;
		case '{':
			lType = lex_ofigure;
			break;
		case '}':
			lType = lex_cfigure;
			break;
		case '?':
			lType = lex_questionmark;
			break;
		case ':':
			lType = lex_colon;
			break;
		case ';':
			lType = lex_semicolon;
			break;
		default:
			if(isDigit(*code))
			{
				lType = lex_number;

				const char *pos = code;
				if(pos[0] == '0' && pos[1] == 'x')
				{
					pos += 2;
					while(isDigit(*pos) || ((*pos & ~0x20) >= 'A' && (*pos & ~0x20) <= 'F'))
						pos++;
				}else{
					while(isDigit(*pos))
						pos++;
				}
				if(*pos == '.')
					pos++;
				while(isDigit(*pos))
					pos++;
				if(*pos == 'e')
				{
					pos++;
					if(*pos == '-')
						pos++;
				}
				while(isDigit(*pos))
					pos++;
				lLength = (int)(pos - code);
			}else if(chartype_table[(unsigned char)*code] & ct_start_symbol){
				const char *pos = code;
				while(chartype_table[(unsigned char)*pos] & ct_symbol)
					pos++;
				lLength = (int)(pos - code);

				if(!(chartype_table[(unsigned char)*pos] & ct_symbol))
				{
					switch(lLength)
					{
					case 2:
						if(memcmp(code, "if", 2) == 0)
							lType = lex_if;
						else if(memcmp(code, "in", 2) == 0)
							lType = lex_in;
						else if(memcmp(code, "do", 2) == 0)
							lType = lex_do;
						break;
					case 3:
						if(memcmp(code, "for", 3) == 0)
							lType = lex_for;
						else if(memcmp(code, "ref", 3) == 0)
							lType = lex_ref;
						else if(memcmp(code, "new", 3) == 0)
							lType = lex_new;
						break;
					case 4:
						if(memcmp(code, "case", 4) == 0)
							lType = lex_case;
						else if(memcmp(code, "else", 4) == 0)
							lType = lex_else;
						else if(memcmp(code, "auto", 4) == 0)
							lType = lex_auto;
						else if(memcmp(code, "true", 4) == 0)
							lType = lex_true;
						else if(memcmp(code, "enum", 4) == 0)
							lType = lex_enum;
						else if(memcmp(code, "with", 4) == 0)
							lType = lex_with;
						break;
					case 5:
						if(memcmp(code, "while", 5) == 0)
							lType = lex_while;
						else if(memcmp(code, "break", 5) == 0)
							lType = lex_break;
						else if(memcmp(code, "class", 5) == 0)
							lType = lex_class;
						else if(memcmp(code, "align", 5) == 0)
							lType = lex_align;
						else if(memcmp(code, "yield", 5) == 0)
							lType = lex_yield;
						else if(memcmp(code, "const", 5) == 0)
							lType = lex_const;
						else if(memcmp(code, "false", 5) == 0)
							lType = lex_false;
						break;
					case 6:
						if(memcmp(code, "switch", 6) == 0)
							lType = lex_switch;
						else if(memcmp(code, "return", 6) == 0)
							lType = lex_return;
						else if(memcmp(code, "typeof", 6) == 0)
							lType = lex_typeof;
						else if(memcmp(code, "sizeof", 6) == 0)
							lType = lex_sizeof;
						else if(memcmp(code, "import", 6) == 0)
							lType = lex_import;
						break;
					case 7:
						if(memcmp(code, "noalign", 7) == 0)
							lType = lex_noalign;
						else if(memcmp(code, "default", 7) == 0)
							lType = lex_default;
						else if(memcmp(code, "typedef", 7) == 0)
							lType = lex_typedef;
						else if(memcmp(code, "nullptr", 7) == 0)
							lType = lex_nullptr;
						else if(memcmp(code, "generic", 7) == 0)
							lType = lex_generic;
						break;
					case 8:
						if(memcmp(code, "continue", 8) == 0)
							lType = lex_continue;
						else if(memcmp(code, "operator", 8) == 0)
							lType = lex_operator;
						break;
					case 9:
						if(memcmp(code, "coroutine", 9) == 0)
							lType = lex_coroutine;
						else if(memcmp(code, "namespace", 9) == 0)
							lType = lex_namespace;
						break;
					case 10:
						if(memcmp(code, "extendable", 10) == 0)
							lType = lex_extendable;
						break;
					}
				}

				if(lType == lex_none)
					lType = lex_string;
			}
		}
		Lexeme lex;

		lex.type = lType;
		lex.length = lLength;

		lex.pos = code;

		lex.line = line;
		lex.column = unsigned(code - lineStart);

		lexems.push_back(lex);

		code += lLength;
		lType = lex_none;
		lLength = 1;
	}

	Lexeme lex;

	lex.type = lex_none;
	lex.length = 1;

	lex.pos = code;

	lex.line = line;
	lex.column = unsigned(code - lineStart);

	lexems.push_back(lex);
}